

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

boolean cant_create(int *mtype,boolean revival)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *mtype;
  iVar2 = 0xfa;
  if ((((iVar1 != 0x11c) && (revival != '\0' || iVar1 != 0x11a)) && (iVar1 != 0x7f)) &&
     (iVar1 != 0x11f)) {
    if (iVar1 != 0x158) {
      return '\0';
    }
    iVar2 = 0x76;
  }
  *mtype = iVar2;
  return '\x01';
}

Assistant:

boolean cant_create(int *mtype, boolean revival)
{

	/* SHOPKEEPERS can be revived now */
	if (*mtype==PM_GUARD || (*mtype==PM_SHOPKEEPER && !revival)
	     || *mtype==PM_ALIGNED_PRIEST || *mtype==PM_ANGEL) {
		*mtype = PM_HUMAN_ZOMBIE;
		return TRUE;
	} else if (*mtype==PM_LONG_WORM_TAIL) {	/* for create_particular() */
		*mtype = PM_LONG_WORM;
		return TRUE;
	}
	return FALSE;
}